

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

uint32_t Average4_SSE2(uint32_t a0,uint32_t a1,uint32_t a2,uint32_t a3)

{
  undefined4 uVar1;
  undefined6 uVar2;
  ushort uVar3;
  undefined4 uVar4;
  undefined6 uVar5;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  undefined1 extraout_XMM0_Ba;
  undefined1 extraout_XMM0_Ba_00;
  undefined1 extraout_XMM0_Bb;
  undefined1 extraout_XMM0_Bb_00;
  undefined1 extraout_XMM0_Bc;
  undefined1 extraout_XMM0_Bc_00;
  char cVar6;
  undefined1 extraout_XMM0_Bd;
  undefined1 extraout_XMM0_Bd_00;
  byte bVar7;
  undefined1 extraout_XMM0_Be;
  undefined1 extraout_XMM0_Be_00;
  char cVar8;
  undefined1 extraout_XMM0_Bf;
  undefined1 extraout_XMM0_Bf_00;
  byte bVar9;
  undefined1 extraout_XMM0_Bg;
  undefined1 extraout_XMM0_Bg_00;
  char cVar10;
  undefined1 extraout_XMM0_Bh;
  undefined1 extraout_XMM0_Bh_00;
  byte bVar11;
  __m128i A0;
  __m128i avg3;
  __m128i sum;
  __m128i avg2;
  __m128i avg1;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 uStack_36;
  undefined2 uStack_34;
  undefined2 uStack_32;
  
  Average2_uint32_16_SSE2(in_EDI,in_ESI);
  Average2_uint32_16_SSE2(in_EDX,in_ECX);
  uVar1 = CONCAT13(extraout_XMM0_Bd_00,
                   CONCAT12(extraout_XMM0_Bc_00,CONCAT11(extraout_XMM0_Bb_00,extraout_XMM0_Ba_00)));
  uVar2 = CONCAT15(extraout_XMM0_Bf_00,CONCAT14(extraout_XMM0_Be_00,uVar1));
  uVar4 = CONCAT13(extraout_XMM0_Bd,
                   CONCAT12(extraout_XMM0_Bc,CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba)));
  uVar5 = CONCAT15(extraout_XMM0_Bf,CONCAT14(extraout_XMM0_Be,uVar4));
  uStack_76 = (short)((uint)uVar1 >> 0x10);
  uStack_74 = (short)((uint6)uVar2 >> 0x20);
  uStack_72 = (short)(CONCAT17(extraout_XMM0_Bh_00,CONCAT16(extraout_XMM0_Bg_00,uVar2)) >> 0x30);
  uStack_86 = (short)((uint)uVar4 >> 0x10);
  uStack_84 = (short)((uint6)uVar5 >> 0x20);
  uStack_82 = (short)(CONCAT17(extraout_XMM0_Bh,CONCAT16(extraout_XMM0_Bg,uVar5)) >> 0x30);
  uVar3 = CONCAT11(extraout_XMM0_Bb_00,extraout_XMM0_Ba_00) +
          CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba);
  bVar7 = (byte)((ushort)(uStack_76 + uStack_86) >> 8);
  bVar9 = (byte)((ushort)(uStack_74 + uStack_84) >> 8);
  bVar11 = (byte)((ushort)(uStack_72 + uStack_82) >> 8);
  uVar1 = CONCAT13(bVar7,CONCAT12((char)(uStack_76 + uStack_86),uVar3));
  uVar2 = CONCAT15(bVar9,CONCAT14((char)(uStack_74 + uStack_84),uVar1));
  uVar3 = uVar3 >> 1;
  cVar6 = (char)(ushort)((uint)uVar1 >> 0x11);
  cVar8 = (char)(ushort)((uint6)uVar2 >> 0x21);
  cVar10 = (char)(ushort)(CONCAT17(bVar11,CONCAT16((char)(uStack_72 + uStack_82),uVar2)) >> 0x31);
  uVar1 = CONCAT13(bVar7 >> 1,CONCAT12(cVar6,uVar3));
  uVar2 = CONCAT15(bVar9 >> 1,CONCAT14(cVar8,uVar1));
  uStack_36 = (ushort)((uint)uVar1 >> 0x10);
  uStack_34 = (ushort)((uint6)uVar2 >> 0x20);
  uStack_32 = (ushort)(CONCAT17(bVar11 >> 1,CONCAT16(cVar10,uVar2)) >> 0x30);
  return CONCAT13((uStack_32 != 0) * (uStack_32 < 0x100) * cVar10 - (0xff < uStack_32),
                  CONCAT12((uStack_34 != 0) * (uStack_34 < 0x100) * cVar8 - (0xff < uStack_34),
                           CONCAT11((uStack_36 != 0) * (uStack_36 < 0x100) * cVar6 -
                                    (0xff < uStack_36),
                                    (uVar3 != 0) * (uVar3 < 0x100) * (char)uVar3 - (0xff < uVar3))))
  ;
}

Assistant:

static WEBP_INLINE uint32_t Average4_SSE2(uint32_t a0, uint32_t a1,
                                          uint32_t a2, uint32_t a3) {
  const __m128i avg1 = Average2_uint32_16_SSE2(a0, a1);
  const __m128i avg2 = Average2_uint32_16_SSE2(a2, a3);
  const __m128i sum = _mm_add_epi16(avg2, avg1);
  const __m128i avg3 = _mm_srli_epi16(sum, 1);
  const __m128i A0 = _mm_packus_epi16(avg3, avg3);
  return (uint32_t)_mm_cvtsi128_si32(A0);
}